

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmGlobalGenerator *this_00;
  __type _Var1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  allocator<char> local_26d;
  ItemIsPath local_26c;
  void *local_268;
  FeatureDescriptor *local_260;
  FeatureDescriptor *local_258;
  string local_250;
  ostringstream e;
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  
  this_00 = this->GlobalGenerator;
  psVar4 = &entry->Feature;
  _Var1 = std::operator==(psVar4,(anonymous_namespace)::DEFAULT_abi_cxx11_);
  cmGlobalGenerator::SplitFrameworkPath(&fwDescriptor,this_00,(string *)entry,Extended - _Var1);
  if (fwDescriptor.super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>.
      _M_payload.super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>
      .super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"Could not parse framework path \"");
    poVar3 = std::operator<<(poVar3,(string *)entry);
    poVar3 = std::operator<<(poVar3,"\" linked by target ");
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,'.');
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  else {
    if (fwDescriptor.super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>.
        _M_payload.
        super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
        super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_payload._M_value.
        Directory._M_string_length != 0) {
      AddFrameworkPath(this,(string *)&fwDescriptor);
    }
    cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
              ((string *)&e,(FrameworkDescriptor *)&fwDescriptor);
    AddLibraryRuntimeInfo(this,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    _Var1 = std::operator==(psVar4,(anonymous_namespace)::DEFAULT_abi_cxx11_);
    if (_Var1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"FRAMEWORK",(allocator<char> *)&local_250);
      AddLibraryFeature(this,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
    }
    iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
    if ((char)iVar2 == '\0') {
      cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
                ((string *)&e,(FrameworkDescriptor *)&fwDescriptor);
      local_26c = Yes;
      local_268 = (void *)0x0;
      local_258 = (FeatureDescriptor *)0x0;
      _Var1 = std::operator==(psVar4,(anonymous_namespace)::DEFAULT_abi_cxx11_);
      if (_Var1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"FRAMEWORK",&local_26d);
      }
      else {
        std::__cxx11::string::string((string *)&local_250,(string *)psVar4);
      }
      local_260 = FindLibraryFeature(this,&local_250);
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                 &local_26c,&local_268,&local_258,&local_260);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&e);
    }
    else {
      local_260 = (FeatureDescriptor *)CONCAT44(local_260._4_4_,1);
      local_250._M_dataplus._M_p = (pointer)0x0;
      local_268 = (void *)0x0;
      _Var1 = std::operator==(psVar4,(anonymous_namespace)::DEFAULT_abi_cxx11_);
      if (_Var1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"FRAMEWORK",(allocator<char> *)&local_26c);
      }
      else {
        std::__cxx11::string::string((string *)&e,(string *)psVar4);
      }
      local_258 = FindLibraryFeature(this,(string *)&e);
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry,
                 (ItemIsPath *)&local_260,(void **)&local_250,&local_268,&local_258);
      std::__cxx11::string::~string((string *)&e);
    }
  }
  std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_reset
            ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)&fwDescriptor);
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(LinkEntry const& entry)
{
  std::string const& item = entry.Item.Value;

  // Try to separate the framework name and path.
  auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
    item,
    entry.Feature == DEFAULT ? cmGlobalGenerator::FrameworkFormat::Relaxed
                             : cmGlobalGenerator::FrameworkFormat::Extended);
  if (!fwDescriptor) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" linked by target "
      << this->Target->GetName() << '.';
    cmSystemTools::Error(e.str());
    return;
  }

  const std::string& fw_path = fwDescriptor->Directory;
  if (!fw_path.empty()) {
    // Add the directory portion to the framework search path.
    this->AddFrameworkPath(fw_path);
  }

  // add runtime information
  this->AddLibraryRuntimeInfo(fwDescriptor->GetFullPath());

  if (entry.Feature == DEFAULT) {
    // ensure FRAMEWORK feature is loaded
    this->AddLibraryFeature("FRAMEWORK");
  }

  if (this->GlobalGenerator->IsXcode()) {
    // Add framework path - it will be handled by Xcode after it's added to
    // "Link Binary With Libraries" build phase
    this->Items.emplace_back(item, ItemIsPath::Yes, nullptr, nullptr,
                             this->FindLibraryFeature(entry.Feature == DEFAULT
                                                        ? "FRAMEWORK"
                                                        : entry.Feature));
  } else {
    this->Items.emplace_back(
      fwDescriptor->GetLinkName(), ItemIsPath::Yes, nullptr, nullptr,
      this->FindLibraryFeature(entry.Feature == DEFAULT ? "FRAMEWORK"
                                                        : entry.Feature));
  }
}